

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

void __thiscall
wasm::SubTypes::getSubTypesFirstSort::SubTypesFirstSort::~SubTypesFirstSort(SubTypesFirstSort *this)

{
  SubTypesFirstSort *this_local;
  
  TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::~TopologicalSort
            (&this->super_TopologicalSort<wasm::HeapType,_SubTypesFirstSort>);
  return;
}

Assistant:

auto getSubTypesFirstSort() const {
    struct SubTypesFirstSort : TopologicalSort<HeapType, SubTypesFirstSort> {
      const SubTypes& parent;

      SubTypesFirstSort(const SubTypes& parent) : parent(parent) {
        for (auto type : parent.types) {
          // The roots are types with no supertype.
          if (!type.getSuperType()) {
            push(type);
          }
        }
      }

      void pushPredecessors(HeapType type) {
        // Things we need to process before each type are its subtypes. Once we
        // know their depth, we can easily compute our own.
        for (auto pred : parent.getStrictSubTypes(type)) {
          push(pred);
        }
      }
    };

    return SubTypesFirstSort(*this);
  }